

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

bool __thiscall sptk::Matrix::GetDeterminant(Matrix *this,double *determinant)

{
  uint uVar1;
  pointer ppdVar2;
  bool bVar3;
  int row;
  ulong uVar4;
  int offset;
  int iVar5;
  ulong uVar6;
  int i;
  ulong uVar7;
  uint num_row;
  double dVar8;
  double determinant_of_submatrix;
  Matrix submatrix;
  
  uVar1 = this->num_row_;
  if ((uVar1 == this->num_column_) && (determinant != (double *)0x0 && 0 < (int)uVar1)) {
    if (uVar1 == 1) {
      *determinant = **(this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
      bVar3 = true;
    }
    else {
      num_row = uVar1 - 1;
      Matrix(&submatrix,num_row,num_row);
      *determinant = 0.0;
      for (uVar7 = 0; uVar7 != uVar1; uVar7 = uVar7 + 1) {
        iVar5 = 0;
        for (uVar4 = 0; uVar4 != num_row; uVar4 = uVar4 + 1) {
          if (uVar7 == uVar4) {
            iVar5 = 1;
          }
          ppdVar2 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          for (uVar6 = 0; num_row != uVar6; uVar6 = uVar6 + 1) {
            submatrix.index_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4][uVar6] = ppdVar2[(int)uVar4 + iVar5][uVar6 + 1];
          }
        }
        bVar3 = GetDeterminant(&submatrix,&determinant_of_submatrix);
        if (!bVar3) break;
        dVar8 = *(this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7];
        if ((uVar7 & 1) != 0) {
          dVar8 = -dVar8;
        }
        *determinant = dVar8 * determinant_of_submatrix + *determinant;
      }
      bVar3 = uVar1 <= uVar7;
      ~Matrix(&submatrix);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Matrix::GetDeterminant(double* determinant) const {
  if (num_row_ != num_column_ || num_row_ <= 0 || NULL == determinant) {
    return false;
  }

  const int num_dimension(num_row_);
  if (1 == num_dimension) {
    *determinant = index_[0][0];
    return true;
  }

  const int num_order(num_dimension - 1);
  Matrix submatrix(num_order, num_order);
  *determinant = 0.0;
  for (int i(0); i < num_dimension; ++i) {
    for (int row(0), offset(0); row < num_order; ++row) {
      if (i == row) {
        offset = 1;
      }
      for (int column(0); column < num_order; ++column) {
        submatrix[row][column] = index_[row + offset][column + 1];
      }
    }
    double determinant_of_submatrix;
    if (!submatrix.GetDeterminant(&determinant_of_submatrix)) {
      return false;
    }
    *determinant += ((0 == i % 2) ? index_[i][0] : -index_[i][0]) *
                    determinant_of_submatrix;
  }
  return true;
}